

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_SINCDECP_r_32(DisasContext_conflict1 *s,arg_incdec_pred *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i64 reg_00;
  TCGv_i64 val_00;
  TCGv_i64 val;
  TCGv_i64 reg;
  TCGContext_conflict1 *tcg_ctx;
  arg_incdec_pred *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    reg_00 = cpu_reg_aarch64(s,a->rd);
    val_00 = tcg_temp_new_i64(tcg_ctx_00);
    do_cntp(s,val_00,a->esz,a->pg,a->pg);
    do_sat_addsub_32(tcg_ctx_00,reg_00,val_00,a->u != 0,a->d != 0);
  }
  return true;
}

Assistant:

static bool trans_SINCDECP_r_32(DisasContext *s, arg_incdec_pred *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 reg = cpu_reg(s, a->rd);
        TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);

        do_cntp(s, val, a->esz, a->pg, a->pg);
        do_sat_addsub_32(tcg_ctx, reg, val, a->u, a->d);
    }
    return true;
}